

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcts.h
# Opt level: O2

Move MCTS::compute_move<NimState>(TestGame root_state,ComputeOptions options)

{
  int iVar1;
  _Rb_tree_color _Var2;
  Node<NimState> *pNVar3;
  mapped_type *pmVar4;
  mapped_type_conflict *pmVar5;
  ostream *poVar6;
  _Base_ptr p_Var7;
  uint uVar8;
  Move MVar9;
  long lVar10;
  long lVar11;
  pointer ppNVar12;
  int t;
  uint uVar13;
  double dVar14;
  Move best_move;
  double local_128;
  double local_120;
  int move;
  double local_110;
  double local_108;
  undefined8 local_100;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> visits;
  vector<std::future<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>,_std::allocator<std::future<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>_>_>
  root_futures;
  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> wins;
  vector<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>,_std::allocator<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>_>
  roots;
  vector<int,_std::allocator<int>_> moves;
  ComputeOptions job_options;
  
  local_100 = root_state._0_8_;
  if (1 < root_state.player_to_move - 1U) {
    assertion_failed("root_state.player_to_move == 1 || root_state.player_to_move == 2",
                     "/workspace/llm4binary/github/license_c_cmakelists/PetterS[P]monte-carlo-tree-search/mcts.h"
                     ,0x17c);
  }
  NimState::get_moves(&moves,(NimState *)&local_100);
  if (moves.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
      != moves.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start) {
    if ((long)moves.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish -
        (long)moves.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start == 4) {
      MVar9 = *moves.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
    }
    else {
      root_futures.
      super__Vector_base<std::future<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>,_std::allocator<std::future<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      root_futures.
      super__Vector_base<std::future<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>,_std::allocator<std::future<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      root_futures.
      super__Vector_base<std::future<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>,_std::allocator<std::future<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      job_options._0_8_ = options._0_8_;
      job_options.max_time = options.max_time;
      job_options._16_8_ = options._16_8_ & 0xffffffffffffff00;
      uVar13 = 0;
      uVar8 = options.number_of_threads;
      if (options.number_of_threads < 1) {
        uVar8 = 0;
      }
      for (; uVar8 != uVar13; uVar13 = uVar13 + 1) {
        visits._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = &local_100;
        visits._M_t._M_impl._0_4_ = uVar13;
        visits._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&job_options;
        std::async<MCTS::compute_move<NimState>(NimState,MCTS::ComputeOptions)::_lambda()_1_&>
                  ((launch)&wins,(anon_class_24_3_cbaa58e5_for__M_head_impl *)0x1);
        std::
        vector<std::future<std::unique_ptr<MCTS::Node<NimState>,std::default_delete<MCTS::Node<NimState>>>>,std::allocator<std::future<std::unique_ptr<MCTS::Node<NimState>,std::default_delete<MCTS::Node<NimState>>>>>>
        ::
        emplace_back<std::future<std::unique_ptr<MCTS::Node<NimState>,std::default_delete<MCTS::Node<NimState>>>>>
                  ((vector<std::future<std::unique_ptr<MCTS::Node<NimState>,std::default_delete<MCTS::Node<NimState>>>>,std::allocator<std::future<std::unique_ptr<MCTS::Node<NimState>,std::default_delete<MCTS::Node<NimState>>>>>>
                    *)&root_futures,
                   (future<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>
                    *)&wins);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &wins._M_t._M_impl.super__Rb_tree_header);
      }
      roots.
      super__Vector_base<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>,_std::allocator<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      roots.
      super__Vector_base<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>,_std::allocator<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      roots.
      super__Vector_base<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>,_std::allocator<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_110 = (double)(ulong)uVar8;
      lVar10 = (long)local_110 << 4;
      for (lVar11 = 0; lVar10 != lVar11; lVar11 = lVar11 + 0x10) {
        std::
        future<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>
        ::get((future<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>
               *)&visits);
        std::
        vector<std::unique_ptr<MCTS::Node<NimState>,std::default_delete<MCTS::Node<NimState>>>,std::allocator<std::unique_ptr<MCTS::Node<NimState>,std::default_delete<MCTS::Node<NimState>>>>>
        ::
        emplace_back<std::unique_ptr<MCTS::Node<NimState>,std::default_delete<MCTS::Node<NimState>>>>
                  ((vector<std::unique_ptr<MCTS::Node<NimState>,std::default_delete<MCTS::Node<NimState>>>,std::allocator<std::unique_ptr<MCTS::Node<NimState>,std::default_delete<MCTS::Node<NimState>>>>>
                    *)&roots,
                   (unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_> *)
                   &visits);
        std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>::
        ~unique_ptr((unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_> *
                    )&visits);
      }
      visits._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &visits._M_t._M_impl.super__Rb_tree_header._M_header;
      visits._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           visits._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
      visits._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      visits._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      wins._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      wins._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      wins._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &wins._M_t._M_impl.super__Rb_tree_header._M_header;
      wins._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_120 = 0.0;
      visits._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           visits._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      wins._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           wins._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      for (dVar14 = 0.0; dVar14 != local_110; dVar14 = (double)((long)dVar14 + 1)) {
        pNVar3 = roots.
                 super__Vector_base<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>,_std::allocator<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[(long)dVar14]._M_t.
                 super___uniq_ptr_impl<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_MCTS::Node<NimState>_*,_std::default_delete<MCTS::Node<NimState>_>_>
                 .super__Head_base<0UL,_MCTS::Node<NimState>_*,_false>._M_head_impl;
        local_120 = (double)((long)local_120 + (long)pNVar3->visits);
        for (ppNVar12 = *(pointer *)
                         &(pNVar3->children).
                          super__Vector_base<MCTS::Node<NimState>_*,_std::allocator<MCTS::Node<NimState>_*>_>
                          ._M_impl;
            ppNVar12 !=
            *(pointer *)
             ((long)&(pNVar3->children).
                     super__Vector_base<MCTS::Node<NimState>_*,_std::allocator<MCTS::Node<NimState>_*>_>
             + 8); ppNVar12 = ppNVar12 + 1) {
          iVar1 = (*ppNVar12)->visits;
          pmVar4 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                   operator[](&visits,&(*ppNVar12)->move);
          *pmVar4 = *pmVar4 + iVar1;
          local_128 = (*ppNVar12)->wins;
          pmVar5 = std::
                   map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                   ::operator[](&wins,&(*ppNVar12)->move);
          *pmVar5 = local_128 + *pmVar5;
        }
      }
      best_move = 0;
      local_108 = (double)(long)local_120;
      local_120 = -1.0;
      MVar9 = 0;
      for (p_Var7 = visits._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var7 != &visits._M_t._M_impl.super__Rb_tree_header;
          p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
        _Var2 = p_Var7[1]._M_color;
        local_128 = (double)*(int *)&p_Var7[1].field_0x4;
        move = _Var2;
        pmVar5 = std::
                 map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
                 operator[](&wins,&move);
        local_110 = *pmVar5;
        dVar14 = (local_110 + 1.0) / (local_128 + 2.0);
        if (local_120 < dVar14) {
          best_move = move;
          MVar9 = move;
          local_120 = dVar14;
        }
        if (((undefined1  [24])options & (undefined1  [24])0x1) != (undefined1  [24])0x0) {
          poVar6 = std::operator<<((ostream *)&std::cerr,"Move: ");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,_Var2);
          poVar6 = std::operator<<(poVar6," (");
          lVar10 = *(long *)poVar6;
          *(undefined8 *)(poVar6 + *(long *)(lVar10 + -0x18) + 0x10) = 2;
          lVar10 = *(long *)(lVar10 + -0x18);
          *(uint *)(poVar6 + lVar10 + 0x18) = *(uint *)(poVar6 + lVar10 + 0x18) & 0xffffff4f | 0x80;
          poVar6 = (ostream *)
                   std::ostream::operator<<(poVar6,(int)((local_128 * 100.0) / local_108 + 0.5));
          poVar6 = std::operator<<(poVar6,"% visits)");
          poVar6 = std::operator<<(poVar6," (");
          lVar10 = *(long *)poVar6;
          *(undefined8 *)(poVar6 + *(long *)(lVar10 + -0x18) + 0x10) = 2;
          lVar10 = *(long *)(lVar10 + -0x18);
          *(uint *)(poVar6 + lVar10 + 0x18) = *(uint *)(poVar6 + lVar10 + 0x18) & 0xffffff4f | 0x80;
          poVar6 = (ostream *)
                   std::ostream::operator<<(poVar6,(int)((local_110 * 100.0) / local_128 + 0.5));
          poVar6 = std::operator<<(poVar6,"% wins)");
          std::endl<char,std::char_traits<char>>(poVar6);
        }
      }
      if (((undefined1  [24])options & (undefined1  [24])0x1) != (undefined1  [24])0x0) {
        pmVar5 = std::
                 map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
                 operator[](&wins,&best_move);
        local_128 = *pmVar5;
        pmVar4 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[](&visits,&best_move);
        iVar1 = *pmVar4;
        poVar6 = std::operator<<((ostream *)&std::cerr,"----");
        std::endl<char,std::char_traits<char>>(poVar6);
        poVar6 = std::operator<<((ostream *)&std::cerr,"Best: ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,best_move);
        std::operator<<(poVar6," (");
        local_120 = (double)iVar1;
        poVar6 = std::ostream::_M_insert<double>((local_120 * 100.0) / local_108);
        poVar6 = std::operator<<(poVar6,"% visits)");
        std::operator<<(poVar6," (");
        poVar6 = std::ostream::_M_insert<double>((local_128 * 100.0) / local_120);
        poVar6 = std::operator<<(poVar6,"% wins)");
        std::endl<char,std::char_traits<char>>(poVar6);
        MVar9 = best_move;
      }
      std::
      _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
      ::~_Rb_tree(&wins._M_t);
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::~_Rb_tree(&visits._M_t);
      std::
      vector<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>,_std::allocator<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>_>
      ::~vector(&roots);
      std::
      vector<std::future<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>,_std::allocator<std::future<std::unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>_>_>_>
      ::~vector(&root_futures);
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&moves.super__Vector_base<int,_std::allocator<int>_>);
    return MVar9;
  }
  assertion_failed("moves.size() > 0",
                   "/workspace/llm4binary/github/license_c_cmakelists/PetterS[P]monte-carlo-tree-search/mcts.h"
                   ,0x17f);
}

Assistant:

typename State::Move compute_move(const State root_state,
                                  const ComputeOptions options)
{
	using namespace std;

	// Will support more players later.
	attest(root_state.player_to_move == 1 || root_state.player_to_move == 2);

	auto moves = root_state.get_moves();
	attest(moves.size() > 0);
	if (moves.size() == 1) {
		return moves[0];
	}

	#ifdef USE_OPENMP
	double start_time = ::omp_get_wtime();
	#endif

	// Start all jobs to compute trees.
	vector<future<unique_ptr<Node<State>>>> root_futures;
	ComputeOptions job_options = options;
	job_options.verbose = false;
	for (int t = 0; t < options.number_of_threads; ++t) {
		auto func = [t, &root_state, &job_options] () -> std::unique_ptr<Node<State>>
		{
			return compute_tree(root_state, job_options, 1012411 * t + 12515);
		};

		root_futures.push_back(std::async(std::launch::async, func));
	}

	// Collect the results.
	vector<unique_ptr<Node<State>>> roots;
	for (int t = 0; t < options.number_of_threads; ++t) {
		roots.push_back(std::move(root_futures[t].get()));
	}

	// Merge the children of all root nodes.
	map<typename State::Move, int> visits;
	map<typename State::Move, double> wins;
	long long games_played = 0;
	for (int t = 0; t < options.number_of_threads; ++t) {
		auto root = roots[t].get();
		games_played += root->visits;
		for (auto child = root->children.cbegin(); child != root->children.cend(); ++child) {
			visits[(*child)->move] += (*child)->visits;
			wins[(*child)->move]   += (*child)->wins;
		}
	}

	// Find the node with the highest score.
	double best_score = -1;
	typename State::Move best_move = typename State::Move();
	for (auto itr: visits) {
		auto move = itr.first;
		double v = itr.second;
		double w = wins[move];
		// Expected success rate assuming a uniform prior (Beta(1, 1)).
		// https://en.wikipedia.org/wiki/Beta_distribution
		double expected_success_rate = (w + 1) / (v + 2);
		if (expected_success_rate > best_score) {
			best_move = move;
			best_score = expected_success_rate;
		}

		if (options.verbose) {
			cerr << "Move: " << itr.first
			     << " (" << setw(2) << right << int(100.0 * v / double(games_played) + 0.5) << "% visits)"
			     << " (" << setw(2) << right << int(100.0 * w / v + 0.5)    << "% wins)" << endl;
		}
	}

	if (options.verbose) {
		auto best_wins = wins[best_move];
		auto best_visits = visits[best_move];
		cerr << "----" << endl;
		cerr << "Best: " << best_move
		     << " (" << 100.0 * best_visits / double(games_played) << "% visits)"
		     << " (" << 100.0 * best_wins / best_visits << "% wins)" << endl;
	}

	#ifdef USE_OPENMP
	if (options.verbose) {
		double time = ::omp_get_wtime();
		std::cerr << games_played << " games played in " << double(time - start_time) << " s. "
		          << "(" << double(games_played) / (time - start_time) << " / second, "
		          << options.number_of_threads << " parallel jobs)." << endl;
	}
	#endif

	return best_move;
}